

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer_demo.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__ptr;
  int iVar1;
  int iVar2;
  strbuffer_t buffer;
  strbuffer_t local_48;
  
  strbuffer_init(&local_48,0x14,10);
  iVar1 = 0x41;
  do {
    strbuffer_reset(&local_48);
    iVar2 = 300;
    do {
      strbuffer_append(&local_48,(char)iVar1);
      __ptr = strbuffer_tostring(&local_48);
      printf("text = %s\n",__ptr);
      printf("buffer capacity = %d, pos = %d, increment = %d\n",(ulong)(uint)local_48.capacity,
             (ulong)(uint)local_48.pos,(ulong)(uint)local_48.increment);
      free(__ptr);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x5b);
  return 0;
}

Assistant:

int main(int argc, char*argv[])
{
    strbuffer_t buffer;
    strbuffer_init(&buffer, 20, 10);
    for (int letter='A'; letter <= 'Z'; letter++)
    {
        strbuffer_reset(&buffer);
        for (int i=0; i < 300; i++)
        {
            strbuffer_append(&buffer, letter);
            char* text = strbuffer_tostring(&buffer);
            printf("text = %s\n", text);
            printf("buffer capacity = %d, pos = %d, increment = %d\n", buffer.capacity, buffer.pos, buffer.increment);
            free(text);
        }
    }
}